

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

char * fmt::v8::detail::
       parse_width<char,fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<char>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v8::detail::specs_handler<char>_> *handler)

{
  int iVar1;
  char *begin_00;
  char *message;
  char *local_58;
  width_adapter local_50;
  error_handler local_48 [40];
  
  local_58 = begin;
  if (begin == end) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/fmt/core.h"
                ,0x8e3,"");
  }
  if ((byte)(*begin - 0x30U) < 10) {
    iVar1 = parse_nonnegative_int<char>(&local_58,end,-1);
    if (iVar1 == -1) {
      message = "number is too big";
LAB_001365ab:
      error_handler::on_error(local_48,message);
    }
    ((handler->super_specs_handler<char>).super_specs_setter<char>.specs_)->width = iVar1;
  }
  else if (*begin == '{') {
    begin_00 = begin + 1;
    if (begin_00 != end) {
      local_58 = begin_00;
      local_50.handler = handler;
      if ((*begin_00 == ':') || (*begin_00 == '}')) {
        specs_handler<char>::get_arg(local_48,&handler->super_specs_handler<char>);
        iVar1 = get_dynamic_spec<fmt::v8::detail::width_checker,fmt::v8::basic_format_arg<fmt::v8::basic_format_context<fmt::v8::appender,char>>,fmt::v8::detail::error_handler>
                          ();
        ((handler->super_specs_handler<char>).super_specs_setter<char>.specs_)->width = iVar1;
      }
      else {
        begin_00 = do_parse_arg_id<char,fmt::v8::detail::parse_width<char,fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<char>>&>(char_const*,char_const*,fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<char>>&)::width_adapter&>
                             (begin_00,end,&local_50);
      }
    }
    if ((begin_00 == end) || (*begin_00 != '}')) {
      message = "invalid format string";
      local_58 = begin_00;
      goto LAB_001365ab;
    }
    local_58 = begin_00 + 1;
  }
  return local_58;
}

Assistant:

FMT_CONSTEXPR auto parse_width(const Char* begin, const Char* end,
                               Handler&& handler) -> const Char* {
  using detail::auto_id;
  struct width_adapter {
    Handler& handler;

    FMT_CONSTEXPR void operator()() { handler.on_dynamic_width(auto_id()); }
    FMT_CONSTEXPR void operator()(int id) { handler.on_dynamic_width(id); }
    FMT_CONSTEXPR void operator()(basic_string_view<Char> id) {
      handler.on_dynamic_width(id);
    }
    FMT_CONSTEXPR void on_error(const char* message) {
      if (message) handler.on_error(message);
    }
  };

  FMT_ASSERT(begin != end, "");
  if ('0' <= *begin && *begin <= '9') {
    int width = parse_nonnegative_int(begin, end, -1);
    if (width != -1)
      handler.on_width(width);
    else
      handler.on_error("number is too big");
  } else if (*begin == '{') {
    ++begin;
    if (begin != end) begin = parse_arg_id(begin, end, width_adapter{handler});
    if (begin == end || *begin != '}')
      return handler.on_error("invalid format string"), begin;
    ++begin;
  }
  return begin;
}